

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryMaterial(aiMaterial *mat)

{
  uint32_t ofs;
  uint32_t n;
  uint32_t uVar1;
  uint i;
  ulong uVar2;
  
  ofs = WriteMagic(0x123d);
  n = Write<unsigned_int>(&mat->mNumProperties);
  for (uVar2 = 0; uVar2 < mat->mNumProperties; uVar2 = uVar2 + 1) {
    uVar1 = WriteBinaryMaterialProperty(mat->mProperties[uVar2]);
    n = n + uVar1 + 8;
  }
  ChangeInteger(ofs,n);
  return n;
}

Assistant:

uint32_t WriteBinaryMaterial(const aiMaterial* mat)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMATERIAL);

	len += Write<unsigned int>(mat->mNumProperties);
	for (unsigned int i = 0; i < mat->mNumProperties;++i) {
		len += WriteBinaryMaterialProperty(mat->mProperties[i])+8;
	}

	ChangeInteger(old,len);
	return len;
}